

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[27],std::__cxx11::string&,char,char_const(&)[45],std::__cxx11::string_const&,char,char_const(&)[103]>
                   (string *__return_storage_ptr__,char (*a) [27],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,char *args,
                   char (*args_1) [45],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char *args_3,char (*args_4) [103])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  char local_130 [32];
  undefined8 local_110;
  undefined8 local_108;
  char *local_100;
  char local_f8 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  size_type local_c0;
  pointer local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  size_t local_90;
  char (*local_88) [45];
  undefined8 local_80;
  size_type local_78;
  pointer local_70;
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  size_t local_48;
  char (*local_40) [103];
  undefined8 local_38;
  
  local_d8.first._M_len = strlen(*a);
  local_d8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (b->_M_dataplus)._M_p;
  local_c0 = b->_M_string_length;
  local_b0 = 0;
  local_f8[0] = *args;
  local_100 = local_f8;
  local_110 = 0;
  local_108 = 1;
  local_a8 = 1;
  local_98 = 0;
  local_d8.first._M_str = *a;
  local_a0 = local_100;
  local_90 = strlen(*args_1);
  local_80 = 0;
  local_70 = (args_2->_M_dataplus)._M_p;
  local_78 = args_2->_M_string_length;
  local_68 = 0;
  local_130[0] = *args_3;
  local_58 = local_130;
  local_60 = 1;
  local_50 = 0;
  local_88 = args_1;
  local_48 = strlen(*args_4);
  local_40 = args_4;
  local_38 = 0;
  views._M_len = 7;
  views._M_array = &local_d8;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}